

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
          (IfcConstructionResource *this)

{
  IfcConstructionResource *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcConstructionResource");
  IfcResource::IfcResource((IfcResource *)this,&PTR_construction_vtable_24__01067440);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>,
             &PTR_construction_vtable_24__010674f0);
  *(undefined8 *)this = 0x1067360;
  *(undefined8 *)&this->field_0x178 = 0x1067428;
  *(undefined8 *)&this->field_0x88 = 0x1067388;
  *(undefined8 *)&this->field_0x98 = 0x10673b0;
  *(undefined8 *)&this->field_0xd0 = 0x10673d8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)0x1067400;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
         field_0x10);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->ResourceGroup);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->ResourceConsumption);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>_>::Maybe
            (&this->BaseQuantity);
  return;
}

Assistant:

IfcConstructionResource() : Object("IfcConstructionResource") {}